

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void renumberCursors(Parse *pParse,Select *p,int iExcept,int *aCsrMap)

{
  undefined1 local_58 [8];
  Walker w;
  int *aCsrMap_local;
  int iExcept_local;
  Select *p_local;
  Parse *pParse_local;
  
  w.u.aiCol = aCsrMap;
  srclistRenumberCursors(pParse,aCsrMap,p->pSrc,iExcept);
  memset(local_58,0,0x30);
  w._32_8_ = w.u;
  w.pParse = (Parse *)renumberCursorsCb;
  w.xExprCallback = sqlite3SelectWalkNoop;
  sqlite3WalkSelect((Walker *)local_58,p);
  return;
}

Assistant:

static void renumberCursors(
  Parse *pParse,                  /* Parse context */
  Select *p,                      /* Select to renumber cursors within */
  int iExcept,                    /* FROM clause item to skip */
  int *aCsrMap                    /* Working space */
){
  Walker w;
  srclistRenumberCursors(pParse, aCsrMap, p->pSrc, iExcept);
  memset(&w, 0, sizeof(w));
  w.u.aiCol = aCsrMap;
  w.xExprCallback = renumberCursorsCb;
  w.xSelectCallback = sqlite3SelectWalkNoop;
  sqlite3WalkSelect(&w, p);
}